

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::GetIDWithSeed(int n,ImGuiID seed)

{
  long lVar1;
  uint uVar2;
  int local_c;
  
  local_c = n;
  uVar2 = ~seed;
  lVar1 = 0;
  do {
    uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar1) ^ uVar2 & 0xff];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  uVar2 = ~uVar2;
  if (GImGui->DebugHookIdInfo == uVar2) {
    DebugHookIdInfo(uVar2,4,(void *)(long)n,(void *)0x0);
  }
  return uVar2;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(int n, ImGuiID seed)
{
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
#endif
    return id;
}